

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O0

void progressbarinit(ProgressData *bar,OperationConfig *config)

{
  OperationConfig *config_local;
  ProgressData *bar_local;
  
  memset(bar,0,0x48);
  if ((*(ulong *)&config->field_0x4e4 >> 4 & 1) != 0) {
    bar->initial_size = config->resume_from;
  }
  update_width(bar);
  bar->out = tool_stderr;
  bar->tick = 0x96;
  bar->barmove = 1;
  return;
}

Assistant:

void progressbarinit(struct ProgressData *bar,
                     struct OperationConfig *config)
{
  memset(bar, 0, sizeof(struct ProgressData));

  /* pass the resume from value through to the progress function so it can
   * display progress towards total file not just the part that is left. */
  if(config->use_resume)
    bar->initial_size = config->resume_from;

  update_width(bar);

  bar->out = tool_stderr;
  bar->tick = 150;
  bar->barmove = 1;
}